

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scheduler.cpp
# Opt level: O2

size_t __thiscall CScheduler::getQueueInfo(CScheduler *this,time_point *first,time_point *last)

{
  long lVar1;
  size_t sVar2;
  long lVar3;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock5;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
            (&criticalblock5,&this->newTaskMutex,"newTaskMutex",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/scheduler.cpp"
             ,0x74,false);
  sVar2 = (this->taskQueue)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  if (sVar2 != 0) {
    (first->__d).__r =
         *(rep *)((this->taskQueue)._M_t._M_impl.super__Rb_tree_header._M_header._M_left + 1);
    lVar3 = std::_Rb_tree_decrement
                      ((_Rb_tree_node_base *)&(this->taskQueue)._M_t._M_impl.super__Rb_tree_header);
    (last->__d).__r = *(rep *)(lVar3 + 0x20);
  }
  std::unique_lock<std::mutex>::~unique_lock(&criticalblock5.super_unique_lock);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return sVar2;
  }
  __stack_chk_fail();
}

Assistant:

size_t CScheduler::getQueueInfo(std::chrono::steady_clock::time_point& first,
                                std::chrono::steady_clock::time_point& last) const
{
    LOCK(newTaskMutex);
    size_t result = taskQueue.size();
    if (!taskQueue.empty()) {
        first = taskQueue.begin()->first;
        last = taskQueue.rbegin()->first;
    }
    return result;
}